

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_sort(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQOuter *arr;
  SQObjectValue SVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  long lVar7;
  long func;
  SQArray *a;
  
  pSVar4 = SQVM::GetAt(v,v->_stackbase);
  if (((pSVar4->super_SQObject)._unVal.pOuter)->_idx < 2) {
LAB_00128866:
    SVar5 = 1;
    sq_settop(v,1);
  }
  else {
    SVar5 = sq_gettop(v);
    func = (ulong)(SVar5 == 2) * 3 + -1;
    arr = (pSVar4->super_SQObject)._unVal.pOuter;
    SVar6 = arr->_idx;
    if (-2 < (long)SVar6) {
      lVar7 = (long)SVar6 / 2;
      do {
        bVar3 = _hsort_sift_down(v,(SQArray *)arr,lVar7,SVar6 - 1,func);
        if (!bVar3) goto LAB_0012885d;
        bVar3 = 0 < lVar7;
        lVar7 = lVar7 + -1;
      } while (bVar3);
    }
    lVar7 = SVar6 * 0x10 + -8;
    do {
      if ((long)SVar6 < 2) goto LAB_00128866;
      pSVar4 = ((SQObjectPtrVec *)&arr->_valptr)->_vals;
      SVar1 = (pSVar4->super_SQObject)._type;
      SVar2 = (pSVar4->super_SQObject)._unVal;
      (pSVar4->super_SQObject)._type = *(SQObjectType *)((long)pSVar4 + lVar7 + -8);
      (pSVar4->super_SQObject)._unVal =
           *(SQObjectValue *)((long)&(pSVar4->super_SQObject)._type + lVar7);
      *(SQObjectType *)((long)pSVar4 + lVar7 + -8) = SVar1;
      *(SQObjectValue *)((long)&(pSVar4->super_SQObject)._type + lVar7) = SVar2;
      bVar3 = _hsort_sift_down(v,(SQArray *)arr,0,SVar6 - 2,func);
      lVar7 = lVar7 + -0x10;
      SVar6 = SVar6 - 1;
    } while (bVar3);
LAB_0012885d:
    SVar5 = -1;
  }
  return SVar5;
}

Assistant:

static SQInteger array_sort(HSQUIRRELVM v)
{
    SQInteger func = -1;
    SQObjectPtr &o = stack_get(v,1);
    if(_array(o)->Size() > 1) {
        if(sq_gettop(v) == 2) func = 2;
        if(!_hsort(v, o, 0, _array(o)->Size()-1, func))
            return SQ_ERROR;

    }
    sq_settop(v,1);
    return 1;
}